

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O3

void irr::executeBlit_TextureCombineColor_32_to_24(SBlitJob *job)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  void *pvVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint *puVar18;
  ulong uVar19;
  uint *local_40;
  
  uVar8 = (ulong)job->width;
  uVar3 = job->height;
  pvVar12 = job->dst;
  if (job->stretch == true) {
    if (uVar3 != 0) {
      fVar1 = (float)job->x_stretch;
      fVar2 = (float)job->y_stretch;
      uVar7 = 0;
      do {
        if (uVar8 != 0) {
          iVar11 = job->srcPitch;
          pvVar6 = job->src;
          uVar17 = 0;
          uVar19 = 0;
          do {
            uVar4 = *(uint *)((long)pvVar6 +
                             ((long)((float)uVar17 * fVar1) & 0xffffffffU) * 4 +
                             (ulong)(uint)((int)(long)((float)uVar7 * fVar2) * iVar11));
            uVar15 = uVar19 & 0xffffffff;
            uVar14 = (uint)*(byte *)((long)pvVar12 + uVar15 + 1);
            uVar13 = uVar14 * 0x100;
            uVar16 = (uint)*(byte *)((long)pvVar12 + uVar15 + 2) |
                     (uint)*(byte *)((long)pvVar12 + uVar15) << 0x10;
            uVar5 = job->argb;
            uVar9 = (uVar5 >> 0x10 & 0xff00) * (uVar4 >> 0x10 & 0xff00);
            if (uVar9 < 0x1000000) {
              uVar13 = uVar13 | uVar16;
            }
            else {
              iVar10 = (uVar9 >> 0x18) - ((int)uVar9 >> 0x1f);
              uVar13 = ((((uVar4 & 0xff00) * (uVar5 & 0xff00) >> 0x10 & 0xff00) + uVar14 * -0x100) *
                        iVar10 >> 8) + uVar13 & 0xff00 |
                       ((((uVar4 & 0xff) * (uVar5 & 0xff) >> 8 |
                         (uVar4 >> 0xc & 0xff0) * (uVar5 >> 0xc & 0xff0) & 0xff0000) - uVar16) *
                        iVar10 >> 8) + uVar16 & 0xff00ff;
            }
            *(char *)((long)pvVar12 + uVar15) = (char)(uVar13 >> 0x10);
            *(char *)((long)pvVar12 + uVar15 + 1) = (char)(uVar13 >> 8);
            *(char *)((long)pvVar12 + uVar15 + 2) = (char)uVar13;
            uVar19 = uVar19 + 3;
            uVar17 = uVar17 + 1;
          } while (uVar8 * 3 != uVar19);
        }
        pvVar12 = (void *)((long)pvVar12 + (ulong)job->dstPitch);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar3);
    }
  }
  else if (uVar3 != 0) {
    local_40 = (uint *)job->src;
    uVar7 = 0;
    do {
      if (uVar8 != 0) {
        uVar19 = 0;
        puVar18 = local_40;
        do {
          uVar15 = uVar19 & 0xffffffff;
          uVar5 = (uint)*(byte *)((long)pvVar12 + uVar15 + 1);
          uVar14 = uVar5 * 0x100;
          uVar9 = (uint)*(byte *)((long)pvVar12 + uVar15 + 2) |
                  (uint)*(byte *)((long)pvVar12 + uVar15) << 0x10;
          uVar17 = *puVar18;
          uVar4 = job->argb;
          uVar13 = (uVar4 >> 0x10 & 0xff00) * (uVar17 >> 0x10 & 0xff00);
          if (uVar13 < 0x1000000) {
            uVar14 = uVar14 | uVar9;
          }
          else {
            iVar11 = (uVar13 >> 0x18) - ((int)uVar13 >> 0x1f);
            uVar14 = ((((uVar17 & 0xff00) * (uVar4 & 0xff00) >> 0x10 & 0xff00) + uVar5 * -0x100) *
                      iVar11 >> 8) + uVar14 & 0xff00 |
                     ((((uVar17 & 0xff) * (uVar4 & 0xff) >> 8 |
                       (uVar17 >> 0xc & 0xff0) * (uVar4 >> 0xc & 0xff0) & 0xff0000) - uVar9) *
                      iVar11 >> 8) + uVar9 & 0xff00ff;
          }
          *(char *)((long)pvVar12 + uVar15) = (char)(uVar14 >> 0x10);
          *(char *)((long)pvVar12 + uVar15 + 1) = (char)(uVar14 >> 8);
          *(char *)((long)pvVar12 + uVar15 + 2) = (char)uVar14;
          uVar19 = uVar19 + 3;
          puVar18 = puVar18 + 1;
        } while (uVar8 * 3 != uVar19);
      }
      local_40 = (uint *)((long)local_40 + (long)job->srcPitch);
      pvVar12 = (void *)((long)pvVar12 + (ulong)job->dstPitch);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar3);
  }
  return;
}

Assistant:

static void executeBlit_TextureCombineColor_32_to_24(const SBlitJob *job)
{
	const u32 w = job->width;
	const u32 h = job->height;
	const u32 *src = static_cast<const u32 *>(job->src);
	u8 *dst = static_cast<u8 *>(job->dst);

	if (job->stretch) {
		const float wscale = job->x_stretch;
		const float hscale = job->y_stretch;

		for (u32 dy = 0; dy < h; ++dy) {
			const u32 src_y = (u32)(dy * hscale);
			src = (u32 *)((u8 *)(job->src) + job->srcPitch * src_y);

			for (u32 dx = 0; dx < w; ++dx) {
				const u32 src_x = src[(u32)(dx * wscale)];
				u8 *writeTo = &dst[dx * 3];
				const u32 dst_x = 0xFF000000 | writeTo[0] << 16 | writeTo[1] << 8 | writeTo[2];
				const u32 combo = PixelCombine32(dst_x, PixelMul32_2(src_x, job->argb));
				*writeTo++ = (combo >> 16) & 0xFF;
				*writeTo++ = (combo >> 8) & 0xFF;
				*writeTo++ = combo & 0xFF;
			}
			dst += job->dstPitch;
		}
	} else {
		for (u32 dy = 0; dy != h; ++dy) {
			for (u32 dx = 0; dx != w; ++dx) {
				u8 *writeTo = &dst[dx * 3];
				const u32 dst_x = 0xFF000000 | writeTo[0] << 16 | writeTo[1] << 8 | writeTo[2];
				const u32 combo = PixelCombine32(dst_x, PixelMul32_2(src[dx], job->argb));
				*writeTo++ = (combo >> 16) & 0xFF;
				*writeTo++ = (combo >> 8) & 0xFF;
				*writeTo++ = combo & 0xFF;
			}

			src = (u32 *)((u8 *)(src) + job->srcPitch);
			dst += job->dstPitch;
		}
	}
}